

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_decode(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *ell64)

{
  secp256k1_fe x;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_ge p;
  secp256k1_ge_storage local_108;
  secp256k1_fe local_c8;
  secp256k1_fe local_a0;
  secp256k1_ge local_78;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ellswift_decode_cold_2();
  }
  else {
    if (ell64 != (uchar *)0x0) {
      secp256k1_fe_impl_set_b32_mod(&local_a0,ell64);
      secp256k1_fe_impl_set_b32_mod(&local_c8,ell64 + 0x20);
      secp256k1_fe_impl_normalize_var(&local_c8);
      secp256k1_ellswift_xswiftec_var((secp256k1_fe *)&local_108,&local_a0,&local_c8);
      secp256k1_ge_set_xo_var(&local_78,(secp256k1_fe *)&local_108,(uint)local_c8.n[0] & 1);
      secp256k1_ge_to_storage(&local_108,&local_78);
      *(uint64_t *)(pubkey->data + 0x30) = local_108.y.n[2];
      *(uint64_t *)(pubkey->data + 0x38) = local_108.y.n[3];
      *(uint64_t *)(pubkey->data + 0x20) = local_108.y.n[0];
      *(uint64_t *)(pubkey->data + 0x28) = local_108.y.n[1];
      *(uint64_t *)(pubkey->data + 0x10) = local_108.x.n[2];
      *(uint64_t *)(pubkey->data + 0x18) = local_108.x.n[3];
      *(uint64_t *)pubkey->data = local_108.x.n[0];
      *(uint64_t *)(pubkey->data + 8) = local_108.x.n[1];
      return 1;
    }
    secp256k1_ellswift_decode_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ellswift_decode(const secp256k1_context *ctx, secp256k1_pubkey *pubkey, const unsigned char *ell64) {
    secp256k1_fe u, t;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(ell64 != NULL);

    secp256k1_fe_set_b32_mod(&u, ell64);
    secp256k1_fe_set_b32_mod(&t, ell64 + 32);
    secp256k1_fe_normalize_var(&t);
    secp256k1_ellswift_swiftec_var(&p, &u, &t);
    secp256k1_pubkey_save(pubkey, &p);
    return 1;
}